

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sylvan_bdd.c
# Opt level: O2

size_t sylvan_serialize_get(BDD bdd)

{
  sylvan_ser *psVar1;
  sylvan_ser s;
  sylvan_ser local_20;
  
  local_20.bdd = bdd & 0x7fffffffffffffff;
  if (local_20.bdd != 0) {
    psVar1 = sylvan_ser_search(sylvan_ser_set,&local_20);
    if (psVar1 == (sylvan_ser *)0x0) {
      __assert_fail("ss != NULL",
                    "/workspace/llm4binary/github/license_c_cmakelists/trolando[P]sylvan/src/sylvan_bdd.c"
                    ,0x8ad,"size_t sylvan_serialize_get(BDD)");
    }
    bdd = bdd & 0x8000000000000000 ^ psVar1->assigned;
  }
  return bdd;
}

Assistant:

size_t
sylvan_serialize_get(BDD bdd)
{
    if (!sylvan_isnode(bdd)) return bdd;
    struct sylvan_ser s, *ss;
    s.bdd = BDD_STRIPMARK(bdd);
    ss = sylvan_ser_search(sylvan_ser_set, &s);
    assert(ss != NULL);
    return BDD_TRANSFERMARK(bdd, ss->assigned);
}